

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  ZSTD_compressedBlockState_t *pZVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_cwksp_alloc_phase_e ZVar4;
  undefined4 uVar5;
  undefined4 uVar9;
  ZSTD_freeFunction p_Var6;
  char *pcVar7;
  ZSTD_allocFunction p_Var8;
  bool bVar10;
  undefined4 uVar11;
  ldmParams_t params_01;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  ZSTD_strategy ZVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined4 in_EAX;
  int iVar22;
  ulong uVar23;
  size_t sVar24;
  size_t __size;
  size_t sVar25;
  seqDef *psVar26;
  ldmEntry_t *__s;
  rawSeq *prVar27;
  ZSTD_Sequence *pZVar28;
  void *pvVar29;
  void *pvVar30;
  ZSTD_compressedBlockState_t *pZVar31;
  U32 *pUVar32;
  size_t buffInSize;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  size_t buffOutSize;
  ZSTD_indexResetPolicy_e forceResetIndex;
  size_t maxChunkSize;
  size_t err_code;
  char *pcVar37;
  size_t __n;
  BYTE *pBVar38;
  BYTE *pBVar39;
  undefined1 auVar40 [16];
  ulong uVar36;
  
  auVar40._0_4_ = -(uint)(0x7fffffe9 < (int)((params->cParams).windowLog - 0x20 ^ 0x80000000));
  auVar40._4_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).chainLog - 0x1f ^ 0x80000000));
  auVar40._8_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).hashLog - 0x1f ^ 0x80000000));
  auVar40._12_4_ = -(uint)(0x7fffffe1 < (int)((params->cParams).searchLog - 0x1f ^ 0x80000000));
  iVar22 = movmskps(in_EAX,auVar40);
  if ((((iVar22 != 0xf) || (4 < (params->cParams).minMatch - 3)) ||
      (0x20000 < (params->cParams).targetLength)) || (8 < (params->cParams).strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x806,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xd0);
  if ((zc->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x810,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x811,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  ZVar3 = (zc->appliedParams).ldmParams.enableLdm;
  if (ZVar3 == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x812,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  maxChunkSize = (zc->appliedParams).maxBlockSize;
  if (maxChunkSize == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x813,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  params_00 = &(zc->appliedParams).ldmParams;
  if (ZVar3 == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
    if ((zc->appliedParams).ldmParams.hashLog < (zc->appliedParams).ldmParams.bucketSizeLog) {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x817,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (zc->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x818,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    maxChunkSize = (zc->appliedParams).maxBlockSize;
  }
  uVar33 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar33) {
    uVar33 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar33 = 1;
  }
  if (uVar33 <= maxChunkSize) {
    maxChunkSize = uVar33;
  }
  uVar34 = 4 - (ulong)((zc->appliedParams).useSequenceProducer != 0 ||
                      (zc->appliedParams).cParams.minMatch == 3);
  buffOutSize = 0;
  uVar23 = maxChunkSize / uVar34;
  buffInSize = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      if (maxChunkSize < 0xff00ff00ff00ff00) {
        uVar36 = 0;
        if (maxChunkSize < 0x20000) {
          uVar36 = (ulong)(0x20000U - (int)maxChunkSize >> 0xb);
        }
        lVar35 = uVar36 + (maxChunkSize >> 8) + maxChunkSize;
        if (lVar35 == 0) goto LAB_001bd3dd;
      }
      else {
LAB_001bd3dd:
        lVar35 = -0x48;
      }
      buffOutSize = lVar35 + 1;
    }
    else {
      buffOutSize = 0;
    }
    buffInSize = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      buffInSize = uVar33 + maxChunkSize;
    }
  }
  cParams = &(zc->appliedParams).cParams;
  uVar5 = (zc->appliedParams).ldmParams.hashRateLog;
  uVar9 = (zc->appliedParams).ldmParams.windowLog;
  params_01.windowLog = uVar9;
  params_01.hashRateLog = uVar5;
  uVar11 = (zc->appliedParams).ldmParams.minMatchLength;
  uVar12 = params_00->enableLdm;
  uVar13 = params_00->hashLog;
  uVar14 = params_00->bucketSizeLog;
  params_01.bucketSizeLog = uVar14;
  params_01.hashLog = uVar13;
  params_01.enableLdm = uVar12;
  params_01.minMatchLength = uVar11;
  sVar24 = ZSTD_ldm_getMaxNbSeq(params_01,maxChunkSize);
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  __size = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,buffInSize,buffOutSize,pledgedSrcSize,
                      (zc->appliedParams).useSequenceProducer,(zc->appliedParams).maxBlockSize);
  if (0xffffffffffffff88 < __size) {
    return __size;
  }
  sVar25 = zc->staticSize;
  if (sVar25 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar30 = (zc->workspace).workspace;
  pvVar29 = (zc->workspace).workspaceEnd;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < __size * 3) {
    bVar10 = false;
  }
  else {
    bVar10 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  if (((ulong)((long)pvVar29 - (long)pvVar30) < __size) || (bVar10)) {
    if (sVar25 != 0) {
      return 0xffffffffffffffc0;
    }
    p_Var6 = (zc->customMem).customFree;
    pvVar29 = (zc->customMem).opaque;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    if (pvVar30 != (void *)0x0) {
      if (p_Var6 == (ZSTD_freeFunction)0x0) {
        free(pvVar30);
      }
      else {
        (*p_Var6)(pvVar29,pvVar30);
      }
    }
    p_Var8 = (zc->customMem).customAlloc;
    if (p_Var8 == (ZSTD_allocFunction)0x0) {
      pvVar30 = malloc(__size);
    }
    else {
      pvVar30 = (*p_Var8)((zc->customMem).opaque,__size);
    }
    if (pvVar30 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    if (((ulong)pvVar30 & 7) != 0) {
      __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x285,
                    "void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t, ZSTD_cwksp_static_alloc_e)")
      ;
    }
    (zc->workspace).workspace = pvVar30;
    (zc->workspace).workspaceEnd = (void *)(__size + (long)pvVar30);
    (zc->workspace).objectEnd = pvVar30;
    (zc->workspace).tableValidEnd = pvVar30;
    pvVar29 = (void *)((ulong)(__size + (long)pvVar30) & 0xffffffffffffffc0);
    (zc->workspace).initOnceStart = pvVar29;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableEnd = pvVar30;
    (zc->workspace).allocStart = pvVar29;
    (zc->workspace).allocFailed = '\0';
    ZSTD_cwksp_assert_internal_consistency(ws);
    (zc->workspace).workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x2c00) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x84c,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar31 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
    if (((ulong)pZVar31 & 7) != 0) {
      __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x1f2,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (((zc->workspace).phase != ZSTD_cwksp_alloc_objects) ||
       (pZVar2 = pZVar31 + 1, (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar2))
    {
      (zc->workspace).allocFailed = '\x01';
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    (zc->workspace).objectEnd = pZVar2;
    (zc->workspace).tableEnd = pZVar2;
    (zc->workspace).tableValidEnd = pZVar2;
    (zc->blockState).prevCBlock = pZVar31;
    if (pZVar31 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar31 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).nextCBlock = pZVar31;
    if (pZVar31 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar32 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
    zc->entropyWorkspace = pUVar32;
    if (pUVar32 == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
    pvVar29 = (zc->workspace).workspaceEnd;
    forceResetIndex = ZSTDirp_reset;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = (void *)((ulong)pvVar29 & 0xffffffffffffffc0);
  (zc->workspace).allocFailed = '\0';
  if (ZSTD_cwksp_alloc_aligned_init_once < (zc->workspace).phase) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_aligned_init_once;
  }
  ZSTD_cwksp_assert_internal_consistency(ws);
  uVar18 = cParams->windowLog;
  uVar19 = cParams->chainLog;
  uVar20 = (zc->appliedParams).cParams.hashLog;
  uVar21 = (zc->appliedParams).cParams.searchLog;
  uVar15 = (zc->appliedParams).cParams.minMatch;
  uVar16 = (zc->appliedParams).cParams.targetLength;
  ZVar17 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar15;
  (zc->blockState).matchState.cParams.targetLength = uVar16;
  (zc->blockState).matchState.cParams.strategy = ZVar17;
  (zc->blockState).matchState.cParams.windowLog = uVar18;
  (zc->blockState).matchState.cParams.chainLog = uVar19;
  (zc->blockState).matchState.cParams.hashLog = uVar20;
  (zc->blockState).matchState.cParams.searchLog = uVar21;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = maxChunkSize;
  ZSTD_XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar31 = (zc->blockState).prevCBlock;
  pZVar31->rep[0] = 1;
  pZVar31->rep[1] = 4;
  pZVar31->rep[2] = 8;
  (pZVar31->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar31->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar31->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar31->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  sVar25 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,forceResetIndex,ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar25) {
    return sVar25;
  }
  psVar26 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,uVar23 * 8);
  (zc->seqStore).sequencesStart = psVar26;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    sVar25 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
    __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar25);
    (zc->ldmState).hashTable = __s;
    memset(__s,0,sVar25);
    prVar27 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,sVar24 * 0xc);
    zc->ldmSequences = prVar27;
    zc->maxNbLdmSequences = sVar24;
    *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).window.base = " ";
    (zc->ldmState).window.dictBase = " ";
    (zc->ldmState).window.dictLimit = 2;
    (zc->ldmState).window.lowLimit = 2;
    (zc->ldmState).window.nextSrc =
         (BYTE *)
         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx"
    ;
    (zc->ldmState).loadedDictEnd = 0;
  }
  if ((zc->appliedParams).useSequenceProducer != 0) {
    sVar24 = maxChunkSize / 3 + 1;
    (zc->externalMatchCtx).seqBufferCapacity = sVar24;
    pZVar28 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws,sVar24 * 0x10);
    (zc->externalMatchCtx).seqBuffer = pZVar28;
  }
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001be048;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bd7d5:
    if (maxChunkSize == 0xffffffffffffffe0) goto LAB_001bd7db;
    pBVar39 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - maxChunkSize));
    pBVar38 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar39 < pBVar38) goto LAB_001be0a5;
    if (pBVar39 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar39;
    }
    (zc->workspace).allocStart = pBVar39;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bd7c3:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001bd7d5;
    }
    pvVar30 = (zc->workspace).workspaceEnd;
    pvVar29 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar29;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
    uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
    pvVar29 = (void *)((long)pvVar29 + uVar33);
    if (pvVar29 <= pvVar30) {
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableEnd = pvVar29;
      if (uVar33 != 0) {
        (zc->workspace).tableValidEnd = pvVar29;
      }
      goto LAB_001bd7c3;
    }
LAB_001bd7db:
    pBVar39 = (BYTE *)0x0;
  }
  (zc->seqStore).litStart = pBVar39;
  (zc->seqStore).maxNbLit = maxChunkSize;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = buffInSize;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001be048;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bd91f:
    if (buffInSize == 0) goto LAB_001bd969;
    pcVar37 = (char *)((long)(zc->workspace).allocStart - buffInSize);
    pcVar7 = (char *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pcVar37 < pcVar7) goto LAB_001be0a5;
    if (pcVar37 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar37;
    }
    (zc->workspace).allocStart = pcVar37;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bd908:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001bd91f;
    }
    pvVar30 = (zc->workspace).workspaceEnd;
    pvVar29 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar29;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
    uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
    pvVar29 = (void *)((long)pvVar29 + uVar33);
    if (pvVar29 <= pvVar30) {
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableEnd = pvVar29;
      if (uVar33 != 0) {
        (zc->workspace).tableValidEnd = pvVar29;
      }
      goto LAB_001bd908;
    }
LAB_001bd969:
    pcVar37 = (char *)0x0;
  }
  zc->inBuff = pcVar37;
  zc->outBuffSize = buffOutSize;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001be048;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bd9fa:
    if (buffOutSize == 0) goto LAB_001bda3f;
    pcVar37 = (char *)((long)(zc->workspace).allocStart - buffOutSize);
    pcVar7 = (char *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pcVar37 < pcVar7) goto LAB_001be0a5;
    if (pcVar37 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar37;
    }
    (zc->workspace).allocStart = pcVar37;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bd9e3:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001bd9fa;
    }
    pvVar30 = (zc->workspace).workspaceEnd;
    pvVar29 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar29;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
    uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
    pvVar29 = (void *)((long)pvVar29 + uVar33);
    if (pvVar29 <= pvVar30) {
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableEnd = pvVar29;
      if (uVar33 != 0) {
        (zc->workspace).tableValidEnd = pvVar29;
      }
      goto LAB_001bd9e3;
    }
LAB_001bda3f:
    pcVar37 = (char *)0x0;
  }
  zc->outBuff = pcVar37;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZVar4 = (zc->workspace).phase;
    __n = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                 (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001be048;
    if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bdc7d:
      pBVar39 = (BYTE *)((long)(zc->workspace).allocStart - __n);
      pBVar38 = (BYTE *)(zc->workspace).tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pBVar39 < pBVar38) goto LAB_001be0a5;
      if (pBVar39 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar39;
      }
      (zc->workspace).allocStart = pBVar39;
    }
    else {
      if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bdc6b:
        (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
        ZSTD_cwksp_assert_internal_consistency(ws);
        goto LAB_001bdc7d;
      }
      pvVar30 = (zc->workspace).workspaceEnd;
      pvVar29 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar29;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
      uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
      pvVar29 = (void *)((long)pvVar29 + uVar33);
      if (pvVar29 <= pvVar30) {
        (zc->workspace).objectEnd = pvVar29;
        (zc->workspace).tableEnd = pvVar29;
        if (uVar33 != 0) {
          (zc->workspace).tableValidEnd = pvVar29;
        }
        goto LAB_001bdc6b;
      }
      pBVar39 = (BYTE *)0x0;
    }
    (zc->ldmState).bucketOffsets = pBVar39;
    memset(pBVar39,0,__n);
  }
  if ((zc->stage == ZSTDcs_init) && (params_00->enableLdm != ZSTD_ps_enable)) {
    (zc->externSeqStore).posInSequence = 0;
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
    (zc->externSeqStore).capacity = 0;
  }
  (zc->seqStore).maxNbSeq = uVar23;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001be048;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bdd7c:
    if (maxChunkSize < uVar34) goto LAB_001bdd81;
    pBVar39 = (BYTE *)((long)(zc->workspace).allocStart - uVar23);
    pBVar38 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar39 < pBVar38) goto LAB_001be0a5;
    if (pBVar39 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar39;
    }
    (zc->workspace).allocStart = pBVar39;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bdd6a:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001bdd7c;
    }
    pvVar30 = (zc->workspace).workspaceEnd;
    pvVar29 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar29;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
    uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
    pvVar29 = (void *)((long)pvVar29 + uVar33);
    if (pvVar29 <= pvVar30) {
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableEnd = pvVar29;
      if (uVar33 != 0) {
        (zc->workspace).tableValidEnd = pvVar29;
      }
      goto LAB_001bdd6a;
    }
LAB_001bdd81:
    pBVar39 = (BYTE *)0x0;
  }
  (zc->seqStore).llCode = pBVar39;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001be048;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bde41:
    if (maxChunkSize < uVar34) goto LAB_001bde46;
    pBVar39 = (BYTE *)((long)(zc->workspace).allocStart - uVar23);
    pBVar38 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar39 < pBVar38) goto LAB_001be0a5;
    if (pBVar39 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar39;
    }
    (zc->workspace).allocStart = pBVar39;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bde2f:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001bde41;
    }
    pvVar30 = (zc->workspace).workspaceEnd;
    pvVar29 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar29;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
    uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
    pvVar29 = (void *)((long)pvVar29 + uVar33);
    if (pvVar29 <= pvVar30) {
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableEnd = pvVar29;
      if (uVar33 != 0) {
        (zc->workspace).tableValidEnd = pvVar29;
      }
      goto LAB_001bde2f;
    }
LAB_001bde46:
    pBVar39 = (BYTE *)0x0;
  }
  (zc->seqStore).mlCode = pBVar39;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) {
LAB_001be048:
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x13b,
                  "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001bdf0f:
    pBVar38 = (BYTE *)(zc->workspace).allocStart;
    if (uVar34 <= maxChunkSize) {
      pBVar39 = pBVar38 + -uVar23;
      pBVar38 = (BYTE *)(zc->workspace).tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pBVar39 < pBVar38) {
LAB_001be0a5:
        __assert_fail("alloc >= bottom",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                      ,0x124,
                      "void *ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *, const size_t)");
      }
      if (pBVar39 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar39;
      }
      (zc->workspace).allocStart = pBVar39;
      pBVar38 = pBVar39;
      goto LAB_001bdf54;
    }
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001bdefd:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001bdf0f;
    }
    pvVar30 = (zc->workspace).workspaceEnd;
    pvVar29 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar29;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar30 & 0xffffffffffffffc0);
    uVar33 = (ulong)(-(int)pvVar29 & 0x3f);
    pvVar29 = (void *)((long)pvVar29 + uVar33);
    if (pvVar29 <= pvVar30) {
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableEnd = pvVar29;
      if (uVar33 != 0) {
        (zc->workspace).tableValidEnd = pvVar29;
      }
      goto LAB_001bdefd;
    }
    pBVar38 = (BYTE *)(zc->workspace).allocStart;
  }
  pBVar39 = (BYTE *)0x0;
LAB_001bdf54:
  (zc->seqStore).ofCode = pBVar39;
  uVar33 = ((long)(zc->workspace).tableEnd + (long)(zc->workspace).workspaceEnd) -
           (long)(pBVar38 + (long)(zc->workspace).workspace);
  if ((__size - 0x80 <= uVar33) && (uVar33 <= __size)) {
    zc->initialized = 1;
    return 0;
  }
  __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x8aa,
                "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
               );
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}